

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodePtr xmlXPathNextPreceding(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  _xmlNode *p_Var2;
  _xmlDoc *p_Var3;
  xmlNodePtr pxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar1 = ctxt->context;
  if (pxVar1 == (xmlXPathContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    cur = pxVar1->node;
    if (cur->type == XML_ATTRIBUTE_NODE) {
      cur = cur->parent;
      if (cur == (_xmlNode *)0x0) {
        return (xmlNodePtr)0x0;
      }
    }
    else if (cur->type == XML_NAMESPACE_DECL) {
      cur = (xmlNodePtr)cur->_private;
      if (cur == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (cur->type == XML_NAMESPACE_DECL) {
        return (xmlNodePtr)0x0;
      }
    }
  }
  if (cur->type != XML_NAMESPACE_DECL) {
    p_Var2 = cur->prev;
    if ((p_Var2 != (_xmlNode *)0x0) && (p_Var2->type == XML_DTD_NODE)) {
      cur = p_Var2;
    }
    while( true ) {
      p_Var2 = cur->prev;
      if (cur->prev != (xmlNodePtr)0x0) {
        do {
          pxVar4 = p_Var2;
          p_Var2 = pxVar4->last;
        } while (p_Var2 != (_xmlNode *)0x0);
        return pxVar4;
      }
      cur = cur->parent;
      if ((cur == (xmlNodePtr)0x0) || (cur == pxVar1->doc->children)) break;
      pxVar4 = pxVar1->node;
      if (pxVar4 == (xmlNodePtr)0x0) {
        return cur;
      }
      if (pxVar4->type == XML_NAMESPACE_DECL) {
        return cur;
      }
      if (cur->type == XML_NAMESPACE_DECL) {
        return cur;
      }
      p_Var3 = cur->doc;
      if (p_Var3 != pxVar4->doc) {
        return cur;
      }
      if (p_Var3 != (_xmlDoc *)cur) {
        if (p_Var3 == (_xmlDoc *)pxVar4) {
          return cur;
        }
        do {
          pxVar4 = pxVar4->parent;
          if (pxVar4 == (_xmlNode *)0x0) {
            return cur;
          }
        } while (pxVar4 != cur);
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextPreceding(xmlXPathParserContextPtr ctxt, xmlNodePtr cur)
{
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
    }
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
	return (NULL);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE))
	cur = cur->prev;
    do {
        if (cur->prev != NULL) {
            for (cur = cur->prev; cur->last != NULL; cur = cur->last) ;
            return (cur);
        }

        cur = cur->parent;
        if (cur == NULL)
            return (NULL);
        if (cur == ctxt->context->doc->children)
            return (NULL);
    } while (xmlXPathIsAncestor(cur, ctxt->context->node));
    return (cur);
}